

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

sexp_conflict
sexp_mutex_state(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict mutex)

{
  sexp psVar1;
  sexp_conflict psVar2;
  char *pcVar3;
  
  if (((ulong)mutex & 3) == 0) {
    psVar1 = (ctx->value).type.setters;
    if ((long)(psVar1->value).context.mark_stack[0xc].end >> 1 == (ulong)mutex->tag) {
      psVar2 = (mutex->value).type.slots;
      if ((mutex->value).type.getters == (sexp)0x3e) {
        pcVar3 = "not-abandoned";
        if (psVar2 == (sexp_conflict)0x0) {
          pcVar3 = "abandoned";
        }
      }
      else {
        if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0x24)) {
          return psVar2;
        }
        pcVar3 = "not-owned";
      }
      psVar2 = (sexp_conflict)sexp_intern(ctx,pcVar3,0xffffffffffffffff);
      return psVar2;
    }
  }
  else {
    psVar1 = (ctx->value).type.setters;
  }
  psVar2 = (sexp_conflict)
           sexp_type_exception(ctx,self,(long)(psVar1->value).context.mark_stack[0xc].prev >> 1);
  return psVar2;
}

Assistant:

sexp sexp_mutex_state (sexp ctx, sexp self, sexp_sint_t n, sexp mutex) {
  if (!sexp_mutexp(ctx, mutex))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_global(ctx, SEXP_G_THREADS_POLLFDS_ID)), mutex);
  if (sexp_truep(sexp_mutex_lockp(mutex))) {
    if (sexp_contextp(sexp_mutex_thread(mutex)))
      return sexp_mutex_thread(mutex);
    else
      return sexp_intern(ctx, "not-owned", -1);
  } else {
    return sexp_intern(ctx, (sexp_mutex_thread(mutex) ? "not-abandoned" : "abandoned"), -1);
  }
}